

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void drawnumber_getbuf(t_drawnumber *x,t_word *data,t_template *template,char *buf)

{
  size_t sVar1;
  int local_5c;
  undefined1 local_58 [8];
  t_atom at;
  int ncopy;
  int size2;
  char *buf2;
  int local_30;
  int type;
  int onset;
  int nchars;
  char *buf_local;
  t_template *template_local;
  t_word *data_local;
  t_drawnumber *x_local;
  
  _onset = buf;
  buf_local = (char *)template;
  template_local = (t_template *)data;
  data_local = (t_word *)x;
  buf2._4_4_ = drawnumber_gettype(x,data,template,&local_30);
  if (buf2._4_4_ < 0) {
    *_onset = '\0';
  }
  else {
    strncpy(_onset,(data_local[0x1b].w_symbol)->s_name,0x400);
    _onset[0x3ff] = '\0';
    sVar1 = strlen(_onset);
    type = (int)sVar1;
    if (buf2._4_4_ == 2) {
      binbuf_gettext(*(_binbuf **)((long)&template_local->t_pdobj + (long)local_30),(char **)&ncopy,
                     (int *)((long)&at.a_w + 4));
      if (0x3ff - type < (int)at.a_w._4_4_) {
        local_5c = 0x3ff - type;
      }
      else {
        local_5c = at.a_w._4_4_;
      }
      at.a_w.w_index = local_5c;
      memcpy(_onset + type,_ncopy,(long)local_5c);
      _onset[type + at.a_w.w_index] = '\0';
      if (type + at.a_w.w_index == 0x3ff) {
        strcpy(_onset + 0x3fc,"...");
      }
      freebytes(_ncopy,(long)(int)at.a_w._4_4_);
    }
    else if (buf2._4_4_ == 0) {
      local_58._0_4_ = A_FLOAT;
      at.a_type = *(t_atomtype *)((long)&template_local->t_pdobj + (long)local_30);
      atom_string((t_atom *)local_58,_onset + type,0x400 - type);
    }
    else if (buf2._4_4_ == 1) {
      strncpy(_onset + type,
              (char *)**(undefined8 **)((long)&template_local->t_pdobj + (long)local_30),
              (long)(0x400 - type));
    }
    else {
      local_58._0_4_ = A_SYMBOL;
      at._0_8_ = *(undefined8 *)((long)&template_local->t_pdobj + (long)local_30);
      atom_string((t_atom *)local_58,_onset + type,0x400 - type);
    }
  }
  return;
}

Assistant:

static void drawnumber_getbuf(t_drawnumber *x, t_word *data,
    t_template *template, char *buf)
{
    int nchars, onset, type = drawnumber_gettype(x, data, template, &onset);
    if (type < 0)
        buf[0] = 0;
    else
    {
        strncpy(buf, x->x_label->s_name, DRAWNUMBER_BUFSIZE);
        buf[DRAWNUMBER_BUFSIZE - 1] = 0;
        nchars = (int)strlen(buf);
        if (type == DT_TEXT)
        {
            char *buf2;
            int size2, ncopy;
            binbuf_gettext(((t_word *)((char *)data + onset))->w_binbuf,
                &buf2, &size2);
            ncopy = (size2 > DRAWNUMBER_BUFSIZE-1-nchars ?
                DRAWNUMBER_BUFSIZE-1-nchars: size2);
            memcpy(buf+nchars, buf2, ncopy);
            buf[nchars+ncopy] = 0;
            if (nchars+ncopy == DRAWNUMBER_BUFSIZE-1)
                strcpy(buf+(DRAWNUMBER_BUFSIZE-4), "...");
            t_freebytes(buf2, size2);
        }
        else
        {
            t_atom at;
            switch(type)
            {
            default:
                SETSYMBOL(&at, ((t_word *)((char *)data + onset))->w_symbol);
                atom_string(&at, buf + nchars, DRAWNUMBER_BUFSIZE - nchars);
                break;
            case DT_FLOAT:
                SETFLOAT(&at, ((t_word *)((char *)data + onset))->w_float);
                atom_string(&at, buf + nchars, DRAWNUMBER_BUFSIZE - nchars);
                break;
            case DT_SYMBOL:
                strncpy(buf + nchars,
                    ((t_word *)((char *)data + onset))->w_symbol->s_name,
                    DRAWNUMBER_BUFSIZE - nchars);
            }
        }
    }
}